

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O0

void helper_syscall_x86_64(CPUX86State *env,int next_eip_addend)

{
  bool bVar1;
  list_item *local_28;
  list_item *cur;
  hook *hook;
  int next_eip_addend_local;
  CPUX86State *env_local;
  
  local_28 = env->uc->hook[1].head;
  while( true ) {
    bVar1 = false;
    if (local_28 != (list_item *)0x0) {
      cur = (list_item *)local_28->data;
      bVar1 = cur != (list_item *)0x0;
    }
    if (!bVar1) break;
    if (((((ulong)cur[1].next & 0x100000000) == 0) &&
        (((cur[1].data <= (void *)env->eip && ((list_item *)env->eip <= cur[2].next)) ||
         (cur[2].next < (list_item *)cur[1].data)))) && (((ulong)cur[1].next & 0x100000000) == 0)) {
      if (*(int *)((long)&cur->next + 4) == 699) {
        (*(code *)cur[2].data)(env->uc,cur[3].next);
      }
      if ((env->uc->stop_request & 1U) != 0) break;
    }
    local_28 = local_28->next;
  }
  env->eip = (long)next_eip_addend + env->eip;
  return;
}

Assistant:

void helper_syscall(CPUX86State *env, int next_eip_addend)
{
    // Unicorn: call registered syscall hooks
    struct hook *hook;
    HOOK_FOREACH_VAR_DECLARE;
    HOOK_FOREACH(env->uc, hook, UC_HOOK_INSN) {
        if (hook->to_delete)
            continue;
        if (!HOOK_BOUND_CHECK(hook, env->eip))
            continue;
        if (hook->insn == UC_X86_INS_SYSCALL)
            ((uc_cb_insn_syscall_t)hook->callback)(env->uc, hook->user_data);

        // the last callback may already asked to stop emulation
        if (env->uc->stop_request)
            break;
    }

    env->eip += next_eip_addend;
}